

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O0

void __thiscall
SemanticAnalyserTest_VariableDeclarationTypeMismatchThrows3_Test::
~SemanticAnalyserTest_VariableDeclarationTypeMismatchThrows3_Test
          (SemanticAnalyserTest_VariableDeclarationTypeMismatchThrows3_Test *this)

{
  void *in_RDI;
  
  ~SemanticAnalyserTest_VariableDeclarationTypeMismatchThrows3_Test
            ((SemanticAnalyserTest_VariableDeclarationTypeMismatchThrows3_Test *)0x1e91d8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, VariableDeclarationTypeMismatchThrows3)
{
  std::string source = R"SRC(
  fn f(): function
  {
    ret \(x: f32): void = { };
  }
  
  fn main(): f32
  {
    let x: f32 = f();
    ret 0;
  }
  )SRC";
  throwTest(source);
}